

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

int32_t __thiscall icu_63::RegexMatcher::end(RegexMatcher *this,UErrorCode *err)

{
  int32_t iVar1;
  UErrorCode *err_local;
  RegexMatcher *this_local;
  
  iVar1 = end(this,0,err);
  return iVar1;
}

Assistant:

int32_t RegexMatcher::end(UErrorCode &err) const {
    return end(0, err);
}